

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OfTests.cpp
# Opt level: O1

void __thiscall IsIterableOfTests::~IsIterableOfTests(IsIterableOfTests *this)

{
  ut11::TestFixture::~TestFixture(&this->super_TestFixture);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("a vector of type int is iterable of int", [&]() {
			AssertThat(ut11::Is::Iterable::Of<int>()(std::vector<int>()), ut11::Is::True);
		});

		Then("a vector of type string is not iterable of int", [&]() {

			AssertThat(ut11::Is::Iterable::Of<int>()(std::vector<std::string>()), ut11::Is::False);
		});

		Then("an int is not iterable of int", [&]() {
			AssertThat(ut11::Is::Iterable::Of<int>()(1), ut11::Is::False);
		});

		Then("a vector of a child is iterable of base class", [&]() {
			AssertThat(ut11::Is::Iterable::Of<BaseClass>()(std::vector<ChildClass>()), ut11::Is::True);
		});

		Then("Is::Iterable::Of<T>() is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Iterable::Of<int>()) >::value, ut11::Is::True);
		});

		Then("Is::EqualTo has an error message", []() {
			AssertThat(ut11::Is::Iterable::Of<int>().GetErrorMessage(0), ut11::Is::Not::EqualTo(""));
		});

	}